

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O1

size_t deStrnlen(char *string,size_t maxSize)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  sVar2 = sVar1;
  if (maxSize != 0) {
    do {
      if (string[sVar1] == '\0') {
        return sVar1;
      }
      sVar1 = sVar1 + 1;
      sVar2 = maxSize;
    } while (maxSize != sVar1);
  }
  return sVar2;
}

Assistant:

size_t deStrnlen (const char* string, size_t maxSize)
{
#if ((DE_COMPILER == DE_COMPILER_MSC) && (DE_OS != DE_OS_WINCE))
	return strnlen_s(string, maxSize);
#else
	size_t len = 0;
	while (len < maxSize && string[len] != 0)
		++len;
	return len;
#endif
}